

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O2

int __thiscall
Inter_Symbol_Generator::G_LT_Matrix_Generator
          (Inter_Symbol_Generator *this,Array_Data_Symbol *p,uint32_t M,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *_ESIs)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  Triple_Generator *this_01;
  ulong uVar1;
  uint uVar2;
  uint8_t **ppuVar3;
  uint uVar4;
  uint uVar5;
  uint row;
  int i;
  ulong uVar6;
  Inter_Symbol_Generator *this_02;
  Triple TVar7;
  
  if (this->G_LT != (uint8_t **)0x0) {
    operator_delete(this->G_LT,8);
  }
  row = (M - p->L) + p->K;
  this_00 = &this->ESIs;
  this_02 = (Inter_Symbol_Generator *)this_00;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(this_00,_ESIs);
  ppuVar3 = new_matrix(this_02,row,p->L);
  this->G_LT = ppuVar3;
  this_01 = &this->triple;
  for (uVar6 = 0; uVar6 != row; uVar6 = uVar6 + 1) {
    TVar7 = Triple_Generator::triple_generator
                      (this_01,p->K,
                       (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar6],p->LP);
    (this_01->_triple).d = (int)TVar7._0_8_;
    (this_01->_triple).a = (int)((ulong)TVar7._0_8_ >> 0x20);
    for (uVar4 = TVar7.b; (this->triple)._triple.b = uVar4, p->L <= uVar4;
        uVar4 = (uVar4 + TVar7.a) % p->LP) {
    }
    this->G_LT[uVar6][uVar4] = '\x01';
    uVar4 = 1;
    while( true ) {
      uVar2 = (this_01->_triple).d - 1;
      uVar5 = p->L - 1;
      if (uVar5 < uVar2) {
        uVar2 = uVar5;
      }
      if (uVar2 < uVar4) break;
      uVar5 = (this->triple)._triple.b;
      do {
        uVar1 = (ulong)(uVar5 + (this->triple)._triple.a) % (ulong)p->LP;
        uVar5 = (uint)uVar1;
      } while (p->L <= uVar5);
      (this->triple)._triple.b = uVar5;
      this->G_LT[uVar6][uVar1] = '\x01';
      uVar4 = uVar4 + 1;
    }
  }
  return 0;
}

Assistant:

int Inter_Symbol_Generator::G_LT_Matrix_Generator(class Array_Data_Symbol *p, uint32_t M, std::vector<uint32_t> _ESIs)
{
	if (G_LT != NULL)
	{
		delete G_LT;
	}
	uint32_t overhead = M - p->L;
	uint32_t N = p->K + overhead;

	ESIs = _ESIs;

//	std::cout << "N: " << N << std::endl;


	G_LT = new_matrix(N, p->L);


	for (int i = 0; i < N; i++)
	{
		triple._triple = triple.triple_generator(p->K, ESIs[i], p->LP);
	//	std::cout << "d : " << triple._triple.d << " a: " << triple._triple.a << " b: " << triple._triple.b << std::endl;
		while(triple._triple.b >= p->L)
		{
			triple._triple.b = (triple._triple.b + triple._triple.a) % p->LP;
		}

		G_LT[i][triple._triple.b] = 1;


		for (int j = 1; j <= std::min(triple._triple.d -1, p->L - 1); j++)
		{
			triple._triple.b = (triple._triple.b + triple._triple.a) % p->LP;
			while(triple._triple.b >= p->L)
			{
				triple._triple.b = (triple._triple.b + triple._triple.a) % p->LP;
			}
			//std::cout << "b: " << triple._triple.b << std::endl;
			G_LT[i][triple._triple.b] = 1;
		}
	}

//	matrix_print(G_LT, N, symbols_p->L);


	return 0;


}